

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

void rlogin_receive(Plug *plug,int urgent,char *data,size_t len)

{
  char c;
  Rlogin *rlogin;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  if (len != 0) {
    if (urgent == 2) {
      if (*data == -0x80) {
        *(undefined1 *)((long)&plug[-8].vt + 2) = 1;
        backend_size((Backend *)(plug + 1),*(int *)((long)&plug[-8].vt + 4),*(int *)&plug[-7].vt);
      }
    }
    else {
      rlogin = (Rlogin *)len;
      len_local = (size_t)data;
      if (((ulong)plug[-8].vt & 0x100) != 0) {
        if (*data == '\0') {
          len_local = (size_t)(data + 1);
          rlogin = (Rlogin *)(len - 1);
        }
        *(undefined1 *)((long)&plug[-8].vt + 1) = 0;
      }
      if (rlogin != (Rlogin *)0x0) {
        c_write((Rlogin *)(plug + -10),(void *)len_local,(size_t)rlogin);
      }
    }
  }
  return;
}

Assistant:

static void rlogin_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    Rlogin *rlogin = container_of(plug, Rlogin, plug);
    if (len == 0)
        return;
    if (urgent == 2) {
        char c;

        c = *data++;
        len--;
        if (c == '\x80') {
            rlogin->cansize = true;
            backend_size(&rlogin->backend,
                         rlogin->term_width, rlogin->term_height);
        }
        /*
         * We should flush everything (aka Telnet SYNCH) if we see
         * 0x02, and we should turn off and on _local_ flow control
         * on 0x10 and 0x20 respectively. I'm not convinced it's
         * worth it...
         */
    } else {
        /*
         * Main rlogin protocol. This is really simple: the first
         * byte is expected to be NULL and is ignored, and the rest
         * is printed.
         */
        if (rlogin->firstbyte) {
            if (data[0] == '\0') {
                data++;
                len--;
            }
            rlogin->firstbyte = false;
        }
        if (len > 0)
            c_write(rlogin, data, len);
    }
}